

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

bool __thiscall
i2p::sam::Session::Connect(Session *this,CService *to,Connection *conn,bool *proxy_error)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  uint16_t uVar2;
  runtime_error *prVar3;
  Session *in_RCX;
  long in_FS_OFFSET;
  runtime_error *e;
  string *result;
  Reply *connect_reply;
  string *dest;
  Reply *lookup_reply;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  string session_id;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffbfc;
  CService *in_stack_fffffffffffffc00;
  CService *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined1 fTry;
  int in_stack_fffffffffffffc1c;
  undefined6 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc26;
  undefined1 in_stack_fffffffffffffc27;
  Session *in_stack_fffffffffffffc28;
  undefined6 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc36;
  undefined1 in_stack_fffffffffffffc37;
  string *in_stack_fffffffffffffc38;
  Session *in_stack_fffffffffffffc40;
  undefined6 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4e;
  undefined1 in_stack_fffffffffffffc4f;
  LogFlags in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  int source_line;
  ConstevalFormatString<2U> in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcb0 [11];
  undefined1 in_stack_fffffffffffffcbb;
  undefined4 in_stack_fffffffffffffcbc;
  size_t in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffd1f;
  byte bVar5;
  string *in_stack_fffffffffffffd20;
  Sock *in_stack_fffffffffffffd28;
  Session *in_stack_fffffffffffffd30;
  allocator<char> local_2b2;
  allocator<char> local_2b1 [23];
  uint16_t local_29a;
  Level in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  unsigned_short *in_stack_fffffffffffffdb8;
  string local_238 [560];
  long local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = CService::GetPort((CService *)
                            CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  if (uVar2 == 0) {
    *(undefined1 *)&(in_RCX->m_private_key_file).super_path._M_pathname._M_dataplus._M_p = 1;
    std::__cxx11::string::string(in_stack_fffffffffffffc10);
    fTry = (undefined1)((uint)in_stack_fffffffffffffc18 >> 0x18);
    std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    CService::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffc38,
               (AnnotatedMixin<std::mutex> *)
               CONCAT17(in_stack_fffffffffffffc37,
                        CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
               (char *)in_stack_fffffffffffffc28,
               (char *)CONCAT17(in_stack_fffffffffffffc27,
                                CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
               in_stack_fffffffffffffc1c,(bool)fTry);
    CreateIfNotCreatedAlready(in_RCX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc08,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc00);
    CService::operator=(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    Hello(in_stack_fffffffffffffc40);
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator=
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc08,
               (unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc00);
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc08);
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc08);
    CNetAddr::ToStringAddr_abi_cxx11_((CNetAddr *)in_stack_fffffffffffffc40);
    tinyformat::format<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffc28,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc27,
                        CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
    SendRequestAndGetReply
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               (bool)in_stack_fffffffffffffd1f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc4f,
                        CONCAT16(in_stack_fffffffffffffc4e,in_stack_fffffffffffffc48)),
               (char *)in_stack_fffffffffffffc40,(allocator<char> *)in_stack_fffffffffffffc38);
    Reply::Get((Reply *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::allocator<char>::~allocator(local_2b1);
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc08);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((char *)in_stack_fffffffffffffc38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc37,
                        CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc28);
    SendRequestAndGetReply
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               (bool)in_stack_fffffffffffffd1f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc4f,
                        CONCAT16(in_stack_fffffffffffffc4e,in_stack_fffffffffffffc48)),
               (char *)in_stack_fffffffffffffc40,(allocator<char> *)in_stack_fffffffffffffc38);
    Reply::Get((Reply *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::allocator<char>::~allocator(&local_2b2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
      if (bVar1) {
        MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffc38,
                   (AnnotatedMixin<std::mutex> *)
                   CONCAT17(in_stack_fffffffffffffc37,
                            CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)),
                   (char *)in_stack_fffffffffffffc28,
                   (char *)CONCAT17(in_stack_fffffffffffffc27,
                                    CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)),
                   in_stack_fffffffffffffc1c,(bool)fTry);
        Disconnect(in_stack_fffffffffffffc28);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Invalid session id");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00),
           bVar1)) {
          *(undefined1 *)&(in_RCX->m_private_key_file).super_path._M_pathname._M_dataplus._M_p = 0;
        }
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  ((char *)prVar3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc27,
                            CONCAT16(in_stack_fffffffffffffc26,in_stack_fffffffffffffc20)));
        std::runtime_error::runtime_error(prVar3,local_238);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      goto LAB_00911ae8;
    }
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator=
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc08,
               (unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc00);
    bVar5 = 1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    Reply::~Reply((Reply *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    Reply::~Reply((Reply *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffc08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  }
  else {
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (char *)in_stack_fffffffffffffc10);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (char *)in_stack_fffffffffffffc10);
      CService::ToStringAddrPort_abi_cxx11_
                ((CService *)
                 CONCAT17(in_stack_fffffffffffffc37,
                          CONCAT16(in_stack_fffffffffffffc36,in_stack_fffffffffffffc30)));
      local_29a = CService::GetPort((CService *)
                                    CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      uVar4 = 1;
      logging_function._M_str = in_stack_fffffffffffffcc8;
      logging_function._M_len = in_stack_fffffffffffffcc0;
      source_file._M_str._3_1_ = in_stack_fffffffffffffcbb;
      source_file._0_11_ = in_stack_fffffffffffffcb0;
      source_file._M_str._4_4_ = in_stack_fffffffffffffcbc;
      LogPrintFormatInternal<std::__cxx11::string,unsigned_short>
                (logging_function,source_file,source_line,in_stack_fffffffffffffc60,
                 in_stack_fffffffffffffda0,in_stack_fffffffffffffca8,in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffdb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbfc,uVar4));
    }
    *(undefined1 *)&(in_RCX->m_private_key_file).super_path._M_pathname._M_dataplus._M_p = 0;
    bVar5 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar5 & 1);
  }
LAB_00911ae8:
  __stack_chk_fail();
}

Assistant:

bool Session::Connect(const CService& to, Connection& conn, bool& proxy_error)
{
    // Refuse connecting to arbitrary ports. We don't specify any destination port to the SAM proxy
    // when connecting (SAM 3.1 does not use ports) and it forces/defaults it to I2P_SAM31_PORT.
    if (to.GetPort() != I2P_SAM31_PORT) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error connecting to %s, connection refused due to arbitrary port %s\n", to.ToStringAddrPort(), to.GetPort());
        proxy_error = false;
        return false;
    }

    proxy_error = true;

    std::string session_id;
    std::unique_ptr<Sock> sock;
    conn.peer = to;

    try {
        {
            LOCK(m_mutex);
            CreateIfNotCreatedAlready();
            session_id = m_session_id;
            conn.me = m_my_addr;
            sock = Hello();
        }

        const Reply& lookup_reply =
            SendRequestAndGetReply(*sock, strprintf("NAMING LOOKUP NAME=%s", to.ToStringAddr()));

        const std::string& dest = lookup_reply.Get("VALUE");

        const Reply& connect_reply = SendRequestAndGetReply(
            *sock, strprintf("STREAM CONNECT ID=%s DESTINATION=%s SILENT=false", session_id, dest),
            false);

        const std::string& result = connect_reply.Get("RESULT");

        if (result == "OK") {
            conn.sock = std::move(sock);
            return true;
        }

        if (result == "INVALID_ID") {
            LOCK(m_mutex);
            Disconnect();
            throw std::runtime_error("Invalid session id");
        }

        if (result == "CANT_REACH_PEER" || result == "TIMEOUT") {
            proxy_error = false;
        }

        throw std::runtime_error(strprintf("\"%s\"", connect_reply.full));
    } catch (const std::runtime_error& e) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error connecting to %s: %s\n", to.ToStringAddrPort(), e.what());
        CheckControlSock();
        return false;
    }
}